

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,Tag *tag)

{
  long lVar1;
  bool bVar2;
  Tag *pTVar3;
  quint32 *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  quint32 value;
  optional<QFont::Tag> maybeTag;
  quint32 *in_stack_ffffffffffffffc8;
  QDataStream *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  QFont::Tag::fromValue((quint32)in_stack_ffffffffffffffd0);
  bVar2 = std::optional::operator_cast_to_bool((optional<QFont::Tag> *)0x7173eb);
  if (bVar2) {
    pTVar3 = std::optional<QFont::Tag>::operator*((optional<QFont::Tag> *)0x7173fb);
    *in_RSI = pTVar3->m_value;
  }
  else {
    QDataStream::setStatus((Status)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QFont::Tag &tag)
{
    quint32 value;
    stream >> value;
    if (const auto maybeTag = QFont::Tag::fromValue(value))
        tag = *maybeTag;
    else
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}